

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_ADJ pRVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar2 = ref_cell_free(ref_grid->cell[0xb]);
  if (uVar2 == 0) {
    uVar2 = ref_cell_free(ref_grid->cell[10]);
    if (uVar2 == 0) {
      uVar2 = ref_cell_free(ref_grid->cell[9]);
      if (uVar2 == 0) {
        uVar2 = ref_cell_free(ref_grid->cell[8]);
        if (uVar2 == 0) {
          uVar2 = ref_cell_create(ref_grid->cell + 8,REF_CELL_TET);
          if (uVar2 == 0) {
            uVar2 = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
            if (uVar2 == 0) {
              uVar2 = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
              if (uVar2 == 0) {
                uVar2 = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (uVar2 == 0) {
                  ref_mpi_stopwatch_stop(ref_mpi,"dump vol cells");
                  iVar3 = ref_node->max;
                  if (0 < iVar3) {
                    lVar6 = 0;
                    do {
                      if ((((-1 < ref_node->global[lVar6]) &&
                           ((pRVar1 = ref_grid->cell[6]->ref_adj, pRVar1->nnode <= lVar6 ||
                            (pRVar1->first[lVar6] == -1)))) &&
                          ((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= lVar6 ||
                           (pRVar1->first[lVar6] == -1)))) &&
                         ((pRVar1 = ref_grid->cell[0]->ref_adj, pRVar1->nnode <= lVar6 ||
                          (pRVar1->first[lVar6] == -1)))) {
                        uVar2 = ref_node_remove_invalidates_sorted(ref_node,(REF_INT)lVar6);
                        if (uVar2 != 0) {
                          pcVar5 = "rm node";
                          uVar4 = 0x4c5;
                          goto LAB_001235a2;
                        }
                        iVar3 = ref_node->max;
                      }
                      lVar6 = lVar6 + 1;
                    } while (lVar6 < iVar3);
                  }
                  ref_mpi_stopwatch_stop(ref_mpi,"del nodes");
                  uVar2 = ref_node_rebuild_sorted_global(ref_node);
                  if (uVar2 == 0) {
                    ref_mpi_stopwatch_stop(ref_mpi,"rebuild nodes");
                    uVar2 = ref_node_synchronize_globals(ref_node);
                    if (uVar2 == 0) {
                      ref_mpi_stopwatch_stop(ref_mpi,"sync nodes");
                      return 0;
                    }
                    pcVar5 = "sync, lazy delete globals";
                    uVar4 = 0x4cb;
                  }
                  else {
                    pcVar5 = "rebuild";
                    uVar4 = 0x4c9;
                  }
                }
                else {
                  pcVar5 = "hex create";
                  uVar4 = 0x4bf;
                }
              }
              else {
                pcVar5 = "pri create";
                uVar4 = 0x4be;
              }
            }
            else {
              pcVar5 = "pyr create";
              uVar4 = 0x4bd;
            }
          }
          else {
            pcVar5 = "tet create";
            uVar4 = 0x4bc;
          }
        }
        else {
          pcVar5 = "tet free";
          uVar4 = 0x4bb;
        }
      }
      else {
        pcVar5 = "pyr free";
        uVar4 = 0x4ba;
      }
    }
    else {
      pcVar5 = "pri free";
      uVar4 = 0x4b9;
    }
  }
  else {
    pcVar5 = "hex free";
    uVar4 = 0x4b8;
  }
LAB_001235a2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar4,
         "ref_grid_drop_volume",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "hex free");
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "pri free");
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "pyr free");
  RSS(ref_cell_free(ref_grid_tet(ref_grid)), "tet free");
  RSS(ref_cell_create(&ref_grid_tet(ref_grid), REF_CELL_TET), "tet create");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");
  ref_mpi_stopwatch_stop(ref_mpi, "dump vol cells");
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_edg(ref_grid), node)) {
      RSS(ref_node_remove_invalidates_sorted(ref_node, node), "rm node");
    }
  }
  ref_mpi_stopwatch_stop(ref_mpi, "del nodes");
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");
  ref_mpi_stopwatch_stop(ref_mpi, "rebuild nodes");
  RSS(ref_node_synchronize_globals(ref_node), "sync, lazy delete globals");
  ref_mpi_stopwatch_stop(ref_mpi, "sync nodes");
  return REF_SUCCESS;
}